

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus.c
# Opt level: O3

int64_t cpu_icount_to_ns_m68k(int64_t icount)

{
  return icount * 8;
}

Assistant:

int64_t cpu_icount_to_ns(int64_t icount)
{
    // return icount << atomic_read(&timers_state.icount_time_shift);
    // from configure_icount(QemuOpts *opts, Error **errp)
    /* 125MIPS seems a reasonable initial guess at the guest speed.
       It will be corrected fairly quickly anyway.  */
    // timers_state.icount_time_shift = 3;

    return icount << 3;
}